

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O3

curi_status
parse_query_item(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  curi_status cVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  char cVar11;
  size_t sVar12;
  
  uVar4 = *offset;
  cVar2 = settings->query_item_separator;
  pcVar9 = "";
  if (uVar4 < len) {
    pcVar9 = uri + uVar4;
  }
  sVar12 = uVar4 + 1;
  *offset = sVar12;
  cVar11 = *pcVar9;
  uVar8 = uVar4;
  if (cVar11 != cVar2) {
    cVar3 = settings->query_item_key_separator;
    while (cVar11 != cVar3) {
      switch(cVar11) {
      case '!':
      case '$':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
      case '/':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case ';':
      case '=':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '_':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '~':
        break;
      default:
        goto switchD_00102907_caseD_22;
      case '%':
        pcVar9 = uri + sVar12;
        if (len <= sVar12) {
          pcVar9 = "";
        }
        uVar1 = uVar8 + 2;
        *offset = uVar1;
        if ((0x36 < (byte)*pcVar9 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar9 - 0x30) & 0x3f) & 1) == 0))
        goto switchD_00102907_caseD_22;
        pcVar9 = uri + uVar1;
        if (len <= uVar1) {
          pcVar9 = "";
        }
        *offset = uVar8 + 3;
        if ((0x36 < (byte)*pcVar9 - 0x30) ||
           (sVar12 = uVar8 + 3,
           (0x7e0000007e03ffU >> ((ulong)((byte)*pcVar9 - 0x30) & 0x3f) & 1) == 0))
        goto switchD_00102907_caseD_22;
      }
      uVar8 = sVar12;
      pcVar9 = uri + uVar8;
      if (len <= uVar8) {
        pcVar9 = "";
      }
      sVar12 = uVar8 + 1;
      *offset = sVar12;
      cVar11 = *pcVar9;
      if (cVar11 == cVar2) break;
    }
  }
switchD_00102907_caseD_22:
  cVar11 = settings->query_item_key_separator;
  pcVar9 = uri + uVar8;
  if (len <= uVar8) {
    pcVar9 = "";
  }
  uVar1 = uVar8 + 1;
  *offset = uVar1;
  if (*pcVar9 == cVar11) {
    pcVar9 = uri + uVar1;
    pcVar10 = "";
    if (uVar1 < len) {
      pcVar10 = pcVar9;
    }
    *offset = uVar8 + 2;
    cVar11 = *pcVar10;
    uVar5 = uVar1;
    uVar7 = uVar8 + 2;
    while (cVar11 != cVar2) {
      switch(cVar11) {
      case '!':
      case '$':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
      case '/':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case ';':
      case '=':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '_':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '~':
        break;
      default:
        goto switchD_001029cb_caseD_22;
      case '%':
        pcVar10 = uri + uVar7;
        if (len <= uVar7) {
          pcVar10 = "";
        }
        uVar7 = uVar5 + 2;
        *offset = uVar7;
        if ((0x36 < (byte)*pcVar10 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar10 - 0x30) & 0x3f) & 1) == 0))
        goto switchD_001029cb_caseD_22;
        pcVar10 = uri + uVar7;
        if (len <= uVar7) {
          pcVar10 = "";
        }
        uVar7 = uVar5 + 3;
        *offset = uVar7;
        if ((0x36 < (byte)*pcVar10 - 0x30) ||
           ((0x7e0000007e03ffU >> ((ulong)((byte)*pcVar10 - 0x30) & 0x3f) & 1) == 0))
        goto switchD_001029cb_caseD_22;
      }
      pcVar10 = uri + uVar7;
      if (len <= uVar7) {
        pcVar10 = "";
      }
      *offset = uVar7 + 1;
      uVar5 = uVar7;
      uVar7 = uVar7 + 1;
      cVar11 = *pcVar10;
    }
switchD_001029cb_caseD_22:
    *offset = uVar5;
    sVar12 = uVar5 - uVar1;
  }
  else {
    *offset = uVar8;
    pcVar9 = (char *)0x0;
    sVar12 = 0;
  }
  cVar6 = handle_query_item(uri + uVar4,uVar8 - uVar4,pcVar9,sVar12,settings,userData);
  return cVar6;
}

Assistant:

static curi_status parse_query_item(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // query_item = query_item_key [query_item_key_separator query_item_value]
    // query_item_key = *query_fragment_char (but no query_item_separator or query_item_key_separator)
    // query_item_separator = settings->query_item_separator (default is "&")
    // query_item_key_separator = settings->query_item_key_separator (default is "=")
    // query_item_value = *query_fragment_char (but no query_item_separator)

    const size_t keyStartOffset = *offset;
    size_t keyEndOffset;

    curi_status status = curi_status_success;
    while (status == curi_status_success)
    {
        size_t previousOffset = *offset;

        char c = *read_char(uri, len, offset);
        if (c == settings->query_item_separator)
            status = curi_status_error;
        else if (c == settings->query_item_key_separator)
            status = curi_status_error;
        else
        {
            switch (c)
            {
                CASE_QUERY_FRAGMENT_CHAR_NO_PCT:
                    status = curi_status_success;
                    break;
                case '%':
                    status = parse_h8(uri, len, offset, settings, userData);
                    break;
                default:
                    status = curi_status_error;
                    break;
            }
        }

        if (status != curi_status_success)
            *offset = previousOffset;
    };

    keyEndOffset = *offset;

    status = parse_char(settings->query_item_key_separator, uri, len, offset, settings, userData);

    if (status == curi_status_success)
    {
        // There is a value
        const size_t valueStartOffset = *offset;

        while (status == curi_status_success)
        {
            size_t previousOffset = *offset;

            char c = *read_char(uri, len, offset);
            if (c == settings->query_item_separator)
                status = curi_status_error;
            else
            {
                switch (c)
                {
                    CASE_QUERY_FRAGMENT_CHAR_NO_PCT:
                        status = curi_status_success;
                        break;
                    case '%':
                        status = parse_h8(uri, len, offset, settings, userData);
                        break;
                    default:
                        status = curi_status_error;
                        break;
                }
            }

            if (status != curi_status_success)
                *offset = previousOffset;
        }

        status = handle_query_item(uri + keyStartOffset, keyEndOffset - keyStartOffset, uri + valueStartOffset, *offset - valueStartOffset, settings, userData);
    }
    else
    {
        *offset = keyEndOffset;
        // There is no value
        status = handle_query_item(uri + keyStartOffset, keyEndOffset - keyStartOffset, 0, 0, settings, userData);
    }

    return status;
}